

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O3

string * __thiscall
adios2sys::Directory::GetFilePath_abi_cxx11_
          (string *__return_storage_ptr__,Directory *this,size_t i)

{
  DirectoryInternals *pDVar1;
  pointer pcVar2;
  
  pDVar1 = this->Internal;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pDVar1->Path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pDVar1->Path)._M_string_length);
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] !=
      '/')) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,
             *(ulong *)&(this->Internal->Files).
                        super__Vector_base<adios2sys::DirectoryInternals::FileData,_std::allocator<adios2sys::DirectoryInternals::FileData>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].Name._M_dataplus);
  return __return_storage_ptr__;
}

Assistant:

std::string Directory::GetFilePath(std::size_t i) const
{
  std::string abs = this->Internal->Path;
  if (!abs.empty() && abs.back() != '/') {
    abs += '/';
  }
  abs += this->Internal->Files[i].Name;
  return abs;
}